

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O0

void * pd_tilde_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_object *owner;
  char *s_00;
  t_symbol *ptVar2;
  t_pd p_Var3;
  void *pvVar4;
  _glist *p_Var5;
  _binbuf *p_Var6;
  _outlet *p_Var7;
  t_float tVar8;
  t_symbol *firstarg;
  t_symbol *scheddir;
  t_symbol *pddir;
  t_sample **g;
  t_float sr;
  int binary;
  int fifo;
  int j;
  int noutsig;
  int ninsig;
  t_pd_tilde *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  owner = (t_object *)pd_new(pd_tilde_class);
  j = 2;
  fifo = 2;
  sr = 7.00649e-45;
  g._4_4_ = 1;
  g._0_4_ = sys_getsr();
  scheddir = sys_libdir;
  s_00 = class_gethelpdir(pd_tilde_class);
  firstarg = gensym(s_00);
  x = (t_pd_tilde *)argv;
  argv_local._4_4_ = argc;
  while (0 < argv_local._4_4_) {
    ptVar2 = atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)x);
    iVar1 = strcmp(ptVar2->s_name,"-sr");
    if ((iVar1 == 0) && (1 < argv_local._4_4_)) {
      g._0_4_ = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
      argv_local._4_4_ = argv_local._4_4_ + -2;
      x = (t_pd_tilde *)&(x->x_obj).te_inlet;
    }
    else {
      iVar1 = strcmp(ptVar2->s_name,"-ninsig");
      if ((iVar1 == 0) && (1 < argv_local._4_4_)) {
        tVar8 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
        j = (int)tVar8;
        argv_local._4_4_ = argv_local._4_4_ + -2;
        x = (t_pd_tilde *)&(x->x_obj).te_inlet;
      }
      else {
        iVar1 = strcmp(ptVar2->s_name,"-noutsig");
        if ((iVar1 == 0) && (1 < argv_local._4_4_)) {
          tVar8 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
          fifo = (int)tVar8;
          argv_local._4_4_ = argv_local._4_4_ + -2;
          x = (t_pd_tilde *)&(x->x_obj).te_inlet;
        }
        else {
          iVar1 = strcmp(ptVar2->s_name,"-fifo");
          if ((iVar1 == 0) && (1 < argv_local._4_4_)) {
            tVar8 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
            sr = (t_float)(int)tVar8;
            argv_local._4_4_ = argv_local._4_4_ + -2;
            x = (t_pd_tilde *)&(x->x_obj).te_inlet;
          }
          else {
            iVar1 = strcmp(ptVar2->s_name,"-pddir");
            if ((iVar1 == 0) && (1 < argv_local._4_4_)) {
              scheddir = atom_getsymbolarg(1,argv_local._4_4_,(t_atom *)x);
              argv_local._4_4_ = argv_local._4_4_ + -2;
              x = (t_pd_tilde *)&(x->x_obj).te_inlet;
            }
            else {
              iVar1 = strcmp(ptVar2->s_name,"-scheddir");
              if ((iVar1 == 0) && (1 < argv_local._4_4_)) {
                firstarg = atom_getsymbolarg(1,argv_local._4_4_,(t_atom *)x);
                argv_local._4_4_ = argv_local._4_4_ + -2;
                x = (t_pd_tilde *)&(x->x_obj).te_inlet;
              }
              else {
                iVar1 = strcmp(ptVar2->s_name,"-ascii");
                if (iVar1 != 0) break;
                g._4_4_ = 0;
                argv_local._4_4_ = argv_local._4_4_ + -1;
                x = (t_pd_tilde *)&(x->x_obj).te_binbuf;
              }
            }
          }
        }
      }
    }
  }
  if (argv_local._4_4_ != 0) {
    pd_error(owner,"usage: pd~ [-sr #] [-ninsig #] [-noutsig #] [-fifo #] [-pddir <>]");
    post("... [-scheddir <>]");
  }
  p_Var3 = (t_pd)clock_new(owner,pd_tilde_tick);
  owner[1].te_g.g_pd = p_Var3;
  pvVar4 = getbytes((long)j << 3);
  *(void **)&owner[2].te_xpix = pvVar4;
  p_Var3 = (t_pd)getbytes((long)fifo << 3);
  owner[3].te_g.g_pd = p_Var3;
  *(int *)((long)&owner[2].te_g.g_pd + 4) = j;
  *(int *)&owner[2].te_g.g_next = fifo;
  *(undefined4 *)&owner[3].te_g.g_next = 0x40;
  *(t_float *)((long)&owner[2].te_g.g_next + 4) = sr;
  *(t_float *)((long)&owner[2].te_binbuf + 4) = g._0_4_;
  owner[2].te_outlet = (_outlet *)scheddir;
  owner[2].te_inlet = (_inlet *)firstarg;
  owner[1].te_outlet = (_outlet *)0x0;
  owner[1].te_inlet = (_inlet *)0x0;
  *(undefined4 *)&owner[2].te_g.g_pd = 0xffffffff;
  p_Var5 = canvas_getcurrent();
  owner[1].te_binbuf = (_binbuf *)p_Var5;
  p_Var6 = binbuf_new();
  *(_binbuf **)&owner[1].te_xpix = p_Var6;
  *(undefined4 *)&owner[2].te_binbuf = g._4_4_;
  for (binary = 1; binary < j; binary = binary + 1) {
    inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  }
  p_Var7 = outlet_new(owner,(t_symbol *)0x0);
  owner[1].te_g.g_next = (_gobj *)p_Var7;
  for (binary = 0; binary < fifo; binary = binary + 1) {
    outlet_new(owner,&s_signal);
  }
  signal(0xd,(__sighandler_t)&DAT_00000001);
  return owner;
}

Assistant:

static void *pd_tilde_new(t_symbol *s, int argc, t_atom *argv)
{
    t_pd_tilde *x = (t_pd_tilde *)pd_new(pd_tilde_class);
    int ninsig = 2, noutsig = 2, j, fifo = 5, binary = 1;
    t_float sr = sys_getsr();
    t_pdsample **g;
    t_symbol *pddir = sys_libdir,
        *scheddir = gensym(class_gethelpdir(pd_tilde_class));
    while (argc > 0)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "-sr") && argc > 1)
        {
            sr = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-ninsig") && argc > 1)
        {
            ninsig = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-noutsig") && argc > 1)
        {
            noutsig = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-fifo") && argc > 1)
        {
            fifo = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-pddir") && argc > 1)
        {
            pddir = atom_getsymbolarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-scheddir") && argc > 1)
        {
            scheddir = atom_getsymbolarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-ascii"))
        {
            binary = 0;
            argc--; argv++;
        }
        else break;
    }

    if (argc)
    {
        pd_error(x,
"usage: pd~ [-sr #] [-ninsig #] [-noutsig #] [-fifo #] [-pddir <>]");
        post(
"... [-scheddir <>]");
    }

    x->x_clock = clock_new(x, (t_method)pd_tilde_tick);
    x->x_insig = (t_pdsample **)t_getbytes(ninsig * sizeof(*x->x_insig));
    x->x_outsig = (t_pdsample **)t_getbytes(noutsig * sizeof(*x->x_outsig));
    x->x_ninsig = ninsig;
    x->x_noutsig = noutsig;
    x->x_blksize = DEFDACBLKSIZE;
    x->x_fifo = fifo;
    x->x_sr = sr;
    x->x_pddir = pddir;
    x->x_schedlibdir = scheddir;
    x->x_infd = 0;
    x->x_outfd = 0;
    x->x_childpid = -1;
    x->x_canvas = canvas_getcurrent();
    x->x_binbuf = binbuf_new();
    x->x_binary = binary;
    for (j = 1, g = x->x_insig; j < ninsig; j++, g++)
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    x->x_outlet1 = outlet_new(&x->x_obj, 0);
    for (j = 0, g = x->x_outsig; j < noutsig; j++, g++)
        outlet_new(&x->x_obj, &s_signal);
#ifndef _WIN32
    signal(SIGPIPE, SIG_IGN);
#endif
    return (x);
}